

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_revsubclamp4cols(int sx,int yl,int yh)

{
  int iVar1;
  lighttable_t *plVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  uint uVar5;
  uint uVar6;
  DWORD b;
  DWORD a;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int pitch;
  int count;
  BYTE *dest;
  BYTE *source;
  BYTE *colormap;
  int yh_local;
  int yl_local;
  int sx_local;
  
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  if (-1 < yh - yl) {
    fg2rgb._4_4_ = (yh - yl) + 1;
    _pitch = dc_destorg + (ylookup[yl] + sx);
    dest = dc_temp + (yl << 2);
    do {
      uVar5 = (pDVar4[*_pitch] | 0x40100400) - pDVar3[plVar2[*dest]];
      uVar6 = uVar5 & 0x40100400;
      uVar5 = uVar6 - (uVar6 >> 5) & uVar5 | 0x1f07c1f;
      *_pitch = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar4[_pitch[1]] | 0x40100400) - pDVar3[plVar2[dest[1]]];
      uVar6 = uVar5 & 0x40100400;
      uVar5 = uVar6 - (uVar6 >> 5) & uVar5 | 0x1f07c1f;
      _pitch[1] = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar4[_pitch[2]] | 0x40100400) - pDVar3[plVar2[dest[2]]];
      uVar6 = uVar5 & 0x40100400;
      uVar5 = uVar6 - (uVar6 >> 5) & uVar5 | 0x1f07c1f;
      _pitch[2] = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar4[_pitch[3]] | 0x40100400) - pDVar3[plVar2[dest[3]]];
      uVar6 = uVar5 & 0x40100400;
      uVar5 = uVar6 - (uVar6 >> 5) & uVar5 | 0x1f07c1f;
      _pitch[3] = RGB32k.All[uVar5 >> 0xf & uVar5];
      dest = dest + 4;
      _pitch = _pitch + iVar1;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
    } while (fg2rgb._4_4_ != 0);
  }
  return;
}

Assistant:

void rt_revsubclamp4cols (int sx, int yl, int yh)
{
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4];
	pitch = dc_pitch;
	colormap = dc_colormap;

	do {
		DWORD a = (bg2rgb[dest[0]] | 0x40100400) - fg2rgb[colormap[source[0]]];
		DWORD b = a;

		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[0] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[1]] | 0x40100400) - fg2rgb[colormap[source[1]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[1] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[2]] | 0x40100400) - fg2rgb[colormap[source[2]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[2] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[3]] | 0x40100400) - fg2rgb[colormap[source[3]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[3] = RGB32k.All[(a>>15) & a];

		source += 4;
		dest += pitch;
	} while (--count);
}